

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

int SetMotorPWMRequestRPLIDARx(RPLIDAR *pRPLIDAR,int pwm)

{
  int iVar1;
  
  iVar1 = SetMotorPWMRequestRPLIDAR(pRPLIDAR,pwm);
  return iVar1;
}

Assistant:

HARDWAREX_API int SetMotorPWMRequestRPLIDARx(RPLIDAR* pRPLIDAR, int pwm)
{
	return SetMotorPWMRequestRPLIDAR(pRPLIDAR, pwm);
}